

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O0

int mbedtls_mpi_core_fill_random
              (mbedtls_mpi_uint *X,size_t X_limbs,size_t n_bytes,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  ulong uVar1;
  size_t __n;
  code *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  void *in_RDI;
  mbedtls_mpi_uint *in_R8;
  size_t overhead;
  size_t limbs;
  int ret;
  uint in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  uVar1 = (in_RDX >> 3) + (ulong)((in_RDX & 7) != 0);
  __n = uVar1 * 8 - in_RDX;
  if (in_RSI < uVar1) {
    local_4 = -4;
  }
  else {
    memset(in_RDI,0,__n);
    memset((void *)((long)in_RDI + uVar1 * 8),0,(in_RSI - uVar1) * 8);
    local_4 = (*in_RCX)(in_R8,(long)in_RDI + __n,in_RDX);
    if (local_4 == 0) {
      mbedtls_mpi_core_bigendian_to_host(in_R8,(ulong)in_stack_ffffffffffffffc8);
    }
  }
  return local_4;
}

Assistant:

int mbedtls_mpi_core_fill_random(
    mbedtls_mpi_uint *X, size_t X_limbs,
    size_t n_bytes,
    int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const size_t limbs = CHARS_TO_LIMBS(n_bytes);
    const size_t overhead = (limbs * ciL) - n_bytes;

    if (X_limbs < limbs) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    memset(X, 0, overhead);
    memset((unsigned char *) X + limbs * ciL, 0, (X_limbs - limbs) * ciL);
    MBEDTLS_MPI_CHK(f_rng(p_rng, (unsigned char *) X + overhead, n_bytes));
    mbedtls_mpi_core_bigendian_to_host(X, limbs);

cleanup:
    return ret;
}